

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitIf
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,If *curr)

{
  bool bVar1;
  int32_t iVar2;
  Literal *this_00;
  Flow local_c8;
  undefined1 local_79;
  undefined4 local_78;
  undefined1 local_68 [8];
  Flow flow;
  If *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  Flow *flow_1;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->condition);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    this_00 = Flow::getSingleValue((Flow *)local_68);
    iVar2 = wasm::Literal::geti32(this_00);
    if (iVar2 == 0) {
      if (*(long *)(flow.breakTo.super_IString.str._M_str + 0x20) == 0) {
        Flow::Flow(__return_storage_ptr__);
      }
      else {
        visit(__return_storage_ptr__,this,
              *(Expression **)(flow.breakTo.super_IString.str._M_str + 0x20));
      }
    }
    else {
      local_79 = 0;
      visit(__return_storage_ptr__,this,
            *(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
      bVar1 = Flow::breaking(__return_storage_ptr__);
      if ((!bVar1) && (*(long *)(flow.breakTo.super_IString.str._M_str + 0x20) == 0)) {
        Flow::Flow(&local_c8);
        Flow::operator=(__return_storage_ptr__,&local_c8);
        Flow::~Flow(&local_c8);
      }
      local_79 = 1;
    }
  }
  local_78 = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitIf(If* curr) {
    NOTE_ENTER("If");
    Flow flow = visit(curr->condition);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow.values);
    if (flow.getSingleValue().geti32()) {
      Flow flow = visit(curr->ifTrue);
      if (!flow.breaking() && !curr->ifFalse) {
        flow = Flow(); // if_else returns a value, but if does not
      }
      return flow;
    }
    if (curr->ifFalse) {
      return visit(curr->ifFalse);
    }
    return Flow();
  }